

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_write_real(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t max_len;
  size_t sStack_28;
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  sVar2 = mbedtls_ssl_get_max_frag_len(ssl);
  sStack_28 = len;
  if ((sVar2 < len) && (sStack_28 = sVar2, (*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x1a81,"fragment larger than the (negotiated) maximum fragment length: %d > %d",len,
               sVar2);
    ssl_local._4_4_ = -0x7100;
  }
  else {
    if (ssl->out_left == 0) {
      ssl->out_msglen = sStack_28;
      ssl->out_msgtype = 0x17;
      memcpy(ssl->out_msg,buf,sStack_28);
      iVar1 = mbedtls_ssl_write_record(ssl);
      if (iVar1 != 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x1a9a,"mbedtls_ssl_write_record",iVar1);
        return iVar1;
      }
    }
    else {
      iVar1 = mbedtls_ssl_flush_output(ssl);
      if (iVar1 != 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x1a8e,"mbedtls_ssl_flush_output",iVar1);
        return iVar1;
      }
    }
    ssl_local._4_4_ = (int)sStack_28;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_real( mbedtls_ssl_context *ssl,
                           const unsigned char *buf, size_t len )
{
    int ret;
#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    size_t max_len = mbedtls_ssl_get_max_frag_len( ssl );

    if( len > max_len )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "fragment larger than the (negotiated) "
                                "maximum fragment length: %d > %d",
                                len, max_len ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }
        else
#endif
            len = max_len;
    }
#endif /* MBEDTLS_SSL_MAX_FRAGMENT_LENGTH */

    if( ssl->out_left != 0 )
    {
        if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_flush_output", ret );
            return( ret );
        }
    }
    else
    {
        ssl->out_msglen  = len;
        ssl->out_msgtype = MBEDTLS_SSL_MSG_APPLICATION_DATA;
        memcpy( ssl->out_msg, buf, len );

        if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
            return( ret );
        }
    }

    return( (int) len );
}